

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O0

int CVodeSetMaxNonlinIters(void *cvode_mem,int maxcor)

{
  undefined4 in_ESI;
  long in_RDI;
  CVodeMem cv_mem;
  int local_4;
  
  if (in_RDI == 0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x31b,"CVodeSetMaxNonlinIters",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_io.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (*(long *)(in_RDI + 0x3d0) == 0) {
    cvProcessError((CVodeMem)0x0,-0x14,0x323,"CVodeSetMaxNonlinIters",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_io.c"
                   ,"A memory request failed.");
    local_4 = -0x14;
  }
  else {
    local_4 = SUNNonlinSolSetMaxIters(*(undefined8 *)(in_RDI + 0x3d0),in_ESI);
  }
  return local_4;
}

Assistant:

int CVodeSetMaxNonlinIters(void* cvode_mem, int maxcor)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  if (cv_mem->NLS == NULL)
  {
    cvProcessError(NULL, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    return (CV_MEM_FAIL);
  }

  return (SUNNonlinSolSetMaxIters(cv_mem->NLS, maxcor));
}